

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall
imrt::Collimator::initializeCoordinates
          (Collimator *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *coord_files)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  runtime_error *this_00;
  istream *piVar6;
  char *pcVar7;
  const_iterator __position;
  mapped_type *this_01;
  reference pvVar8;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  long in_RDI;
  pair<double,_double> pVar9;
  int j;
  int angle;
  int i;
  bool flag;
  double y;
  double x;
  stringstream ss;
  string linec;
  string line;
  ifstream myfile;
  value_type *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  mapped_type in_stack_fffffffffffffab4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffab8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffac0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffac8;
  mapped_type *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  byte in_stack_fffffffffffffaf7;
  mapped_type *in_stack_fffffffffffffb18;
  Collimator *in_stack_fffffffffffffb20;
  iterator in_stack_fffffffffffffb88;
  iterator in_stack_fffffffffffffb90;
  int local_454;
  _Self local_430;
  _Self local_428;
  pair<double,_double> local_420;
  int local_40c;
  int local_408;
  byte local_401;
  double local_400;
  double local_3f8;
  long local_3e0 [49];
  string local_258 [32];
  string local_238 [32];
  string local_218 [520];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218);
  std::__cxx11::string::string(local_238);
  std::__cxx11::string::string(local_258);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3e0);
  local_408 = 0;
  while( true ) {
    uVar3 = (ulong)local_408;
    sVar4 = std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(local_10);
    if (sVar4 <= uVar3) {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60));
      *(int *)(in_RDI + 0x94) = (int)sVar4;
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78));
      *(int *)(in_RDI + 0x98) = (int)sVar4;
      *(int *)(in_RDI + 0x90) = *(int *)(in_RDI + 0x94) * *(int *)(in_RDI + 0x98);
      setActiveBeamlets((Collimator *)in_stack_fffffffffffffb90._M_current,
                        (map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                         *)in_stack_fffffffffffffb88._M_current);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_3e0);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_238);
      std::ifstream::~ifstream(local_218);
      return;
    }
    pvVar5 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_10,(long)local_408);
    local_40c = pvVar5->first;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffac0._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffffab8);
    pvVar5 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_10,(long)local_408);
    std::ifstream::open(local_218,(int)pvVar5 + _S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) break;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_218,local_238);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      local_401 = 0;
      std::ios::clear((long)local_3e0 + *(long *)(local_3e0[0] + -0x18),0);
      std::__cxx11::stringstream::str((string *)local_3e0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3e0,local_258,'\t');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3e0,local_258,'\t');
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_3f8 = atof(pcVar7);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_3e0,local_258,'\t');
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_400 = atof(pcVar7);
      __position._M_current =
           (double *)
           std::
           map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
           ::operator[]((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                        (key_type_conflict *)in_stack_fffffffffffffae8);
      pVar9 = std::make_pair<double&,double&>
                        ((double *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                         &in_stack_fffffffffffffaa8->first);
      local_420 = pVar9;
      std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffaa8);
      local_428._M_node =
           (_Base_ptr)
           std::
           map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::find((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                   *)in_stack_fffffffffffffaa8,(key_type_conflict1 *)0x155bdb);
      local_430._M_node =
           (_Base_ptr)
           std::
           map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
           ::end((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                  *)in_stack_fffffffffffffaa8);
      bVar2 = std::operator==(&local_428,&local_430);
      if (bVar2) {
        std::
        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                     (key_type_conflict1 *)in_stack_fffffffffffffae8);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0._M_current,
                   (value_type_conflict1 *)in_stack_fffffffffffffab8);
        insertXorder(in_stack_fffffffffffffb20,(double)in_stack_fffffffffffffb18);
        insertYorder(in_stack_fffffffffffffb20,(double)in_stack_fffffffffffffb18);
      }
      else {
        in_stack_fffffffffffffb20 =
             (Collimator *)
             std::
             map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                          (key_type_conflict1 *)in_stack_fffffffffffffae8);
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa8);
        in_stack_fffffffffffffb18 =
             std::
             map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                          (key_type_conflict1 *)in_stack_fffffffffffffae8);
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa8);
        std::
        find<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                   (double *)in_stack_fffffffffffffab8);
        std::
        map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                     (key_type_conflict1 *)in_stack_fffffffffffffae8);
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa8);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (bVar2) {
          local_401 = 1;
        }
        local_454 = 0;
        while( true ) {
          this_01 = std::
                    map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                                 (key_type_conflict1 *)in_stack_fffffffffffffae8);
          sVar4 = std::vector<double,_std::allocator<double>_>::size(this_01);
          in_stack_fffffffffffffaf7 = 0;
          if ((ulong)(long)local_454 < sVar4) {
            in_stack_fffffffffffffaf7 = local_401 ^ 0xff;
          }
          if ((in_stack_fffffffffffffaf7 & 1) == 0) break;
          in_stack_fffffffffffffae8 =
               std::
               map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                            (key_type_conflict1 *)in_stack_fffffffffffffae8);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_stack_fffffffffffffae8,(long)local_454);
          if (local_400 < *pvVar8) {
            std::
            map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                         (key_type_conflict1 *)in_stack_fffffffffffffae8);
            std::
            map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                         (key_type_conflict1 *)in_stack_fffffffffffffae8);
            in_stack_fffffffffffffb90 =
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa8);
            __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
            operator+(in_stack_fffffffffffffab8,
                      CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
            __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
            __normal_iterator<double*>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffaa8);
            in_stack_fffffffffffffb88 =
                 std::vector<double,_std::allocator<double>_>::insert
                           ((vector<double,_std::allocator<double>_> *)pVar9.first,__position,
                            (value_type_conflict1 *)pVar9.second);
            local_401 = 1;
          }
          local_454 = local_454 + 1;
        }
        if ((local_401 & 1) == 0) {
          in_stack_fffffffffffffac8._M_current =
               (double *)
               std::
               map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator[]((map<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                            (key_type_conflict1 *)in_stack_fffffffffffffae8);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0._M_current
                     ,(value_type_conflict1 *)in_stack_fffffffffffffab8);
        }
        insertYorder(in_stack_fffffffffffffb20,(double)in_stack_fffffffffffffb18);
      }
    }
    std::ifstream::close();
    in_stack_fffffffffffffac0._M_current =
         (double *)
         std::
         map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
         ::operator[]((map<int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                      (key_type_conflict *)in_stack_fffffffffffffae8);
    sVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 in_stack_fffffffffffffac0._M_current);
    in_stack_fffffffffffffab4 = (mapped_type)sVar4;
    in_stack_fffffffffffffab8 =
         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                    (key_type_conflict *)in_stack_fffffffffffffae8);
    *(mapped_type *)&in_stack_fffffffffffffab8->_M_current = in_stack_fffffffffffffab4;
    local_408 = local_408 + 1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"error reading file.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Collimator::initializeCoordinates(vector < pair<int, string> >& coord_files) {
  ifstream myfile;
  string line, linec;
  stringstream ss;
  double x, y;
  bool flag;

  //nb_angles=coord_files.size();

  for (int i=0 ; i < coord_files.size(); i++) {
    // Open file
    int angle = coord_files[i].first;
    angles.push_back(angle);
    myfile.open(coord_files[i].second);
    if (!myfile.is_open())
      throw runtime_error("error reading file.");

    // Read lines of the file
    while (getline (myfile,line)) {
      flag=false;
      ss.clear(); ss.str(line);
      getline (ss,linec,'\t'); //the first number is discarded (beamlet id)
      getline (ss,linec,'\t');
      x = atof(linec.c_str());
      getline (ss,linec,'\t');
      y = atof(linec.c_str());


      angle_coord[angle].push_back(make_pair(x,y));

      if (beam_coord.find(x) == beam_coord.end()) {
        // New x coordinate
        beam_coord[x].push_back(y);
        insertXorder(x);
        insertYorder(y);
      } else {
        if (find(beam_coord[x].begin(), beam_coord[x].end(), y) != beam_coord[x].end())
          flag=true;
        // New y coordinate: insert in order
        for (int j=0; j < beam_coord[x].size() && !flag; j++) {
          if (beam_coord[x][j] > y) {
            beam_coord[x].insert(beam_coord[x].begin()+j, y);
            flag=true;
          }
        }
        if (!flag) beam_coord[x].push_back(y);
        insertYorder(y);
      }
    }
    myfile.close();
    nb_angle_beamlets[angle]=(angle_coord[angle].size());
  }
  xdim = xcoord.size();
  ydim = ycoord.size();
  nb_beamlets= xdim*ydim;
  //printCoordinates();

  setActiveBeamlets(angle_coord);
  //printActiveBeam();
}